

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O3

aphy_transform * __thiscall
APhyBullet::BulletCollisionObject::getTransform(BulletCollisionObject *this)

{
  btCollisionObject *pbVar1;
  aphy_vector3 aVar2;
  undefined1 auVar3 [12];
  aphy_vector3 aVar4;
  aphy_vector3 aVar5;
  aphy_vector3 aVar6;
  aphy_transform *in_RDI;
  
  pbVar1 = this->handle;
  auVar3 = SUB1612(*(undefined1 (*) [16])(pbVar1->m_worldTransform).m_basis.m_el[0].m_floats,0);
  aVar2.pad = 0.0;
  aVar2.x = (aphy_scalar)auVar3._0_4_;
  aVar2.y = (aphy_scalar)auVar3._4_4_;
  aVar2.z = (aphy_scalar)auVar3._8_4_;
  (in_RDI->rotation).firstRow = aVar2;
  auVar3 = SUB1612(*(undefined1 (*) [16])(pbVar1->m_worldTransform).m_basis.m_el[1].m_floats,0);
  aVar4.pad = 0.0;
  aVar4.x = (aphy_scalar)auVar3._0_4_;
  aVar4.y = (aphy_scalar)auVar3._4_4_;
  aVar4.z = (aphy_scalar)auVar3._8_4_;
  (in_RDI->rotation).secondRow = aVar4;
  auVar3 = SUB1612(*(undefined1 (*) [16])(pbVar1->m_worldTransform).m_basis.m_el[2].m_floats,0);
  aVar5.pad = 0.0;
  aVar5.x = (aphy_scalar)auVar3._0_4_;
  aVar5.y = (aphy_scalar)auVar3._4_4_;
  aVar5.z = (aphy_scalar)auVar3._8_4_;
  (in_RDI->rotation).thirdRow = aVar5;
  auVar3 = SUB1612(*(undefined1 (*) [16])(pbVar1->m_worldTransform).m_origin.m_floats,0);
  aVar6.pad = 0.0;
  aVar6.x = (aphy_scalar)auVar3._0_4_;
  aVar6.y = (aphy_scalar)auVar3._4_4_;
  aVar6.z = (aphy_scalar)auVar3._8_4_;
  in_RDI->origin = aVar6;
  return in_RDI;
}

Assistant:

aphy_transform BulletCollisionObject::getTransform()
{
    return convertTransform(handle->getWorldTransform());
}